

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsscene.cpp
# Opt level: O2

QList<QGraphicsItem_*> * __thiscall
QGraphicsScene::selectedItems(QList<QGraphicsItem_*> *__return_storage_ptr__,QGraphicsScene *this)

{
  long lVar1;
  Span *pSVar2;
  bool bVar3;
  ulong uVar4;
  long in_FS_OFFSET;
  QGraphicsItem *item;
  anon_struct_8_1_898a9ca8_for_storage local_58;
  piter local_50;
  QHash<QGraphicsItem_*,_QHashDummyValue> local_40;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  lVar1 = *(long *)(this + 8);
  local_40.d = (Data *)0x0;
  local_50 = (piter)QHash<QGraphicsItem_*,_QHashDummyValue>::begin
                              ((QHash<QGraphicsItem_*,_QHashDummyValue> *)(lVar1 + 0x128));
  while( true ) {
    if (local_50.d == (Data<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_> *)0x0 &&
        local_50.bucket == 0) break;
    pSVar2 = (local_50.d)->spans;
    uVar4 = local_50.bucket >> 7;
    local_58.data =
         *&pSVar2[uVar4].entries[pSVar2[uVar4].offsets[(uint)local_50.bucket & 0x7f]].storage.data;
    bVar3 = QGraphicsItem::isSelected((QGraphicsItem *)local_58.data);
    if (bVar3) {
      QSet<QGraphicsItem_*>::operator<<
                ((QSet<QGraphicsItem_*> *)&local_40,(QGraphicsItem **)&local_58);
    }
    QHashPrivate::iterator<QHashPrivate::Node<QGraphicsItem_*,_QHashDummyValue>_>::operator++
              (&local_50);
  }
  QHash<QGraphicsItem_*,_QHashDummyValue>::operator=
            ((QHash<QGraphicsItem_*,_QHashDummyValue> *)(*(long *)(this + 8) + 0x128),&local_40);
  QSet<QGraphicsItem_*>::values(__return_storage_ptr__,(QSet<QGraphicsItem_*> *)(lVar1 + 0x128));
  QHash<QGraphicsItem_*,_QHashDummyValue>::~QHash(&local_40);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return __return_storage_ptr__;
  }
  __stack_chk_fail();
}

Assistant:

QList<QGraphicsItem *> QGraphicsScene::selectedItems() const
{
    Q_D(const QGraphicsScene);

    // Optimization: Lazily removes items that are not selected.
    QGraphicsScene *that = const_cast<QGraphicsScene *>(this);
    QSet<QGraphicsItem *> actuallySelectedSet;
    for (QGraphicsItem *item : std::as_const(that->d_func()->selectedItems)) {
        if (item->isSelected())
            actuallySelectedSet << item;
    }

    that->d_func()->selectedItems = actuallySelectedSet;

    return d->selectedItems.values();
}